

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitReturn
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Return *curr)

{
  Signature SVar1;
  
  if (this->func == (Function *)0x0) {
    __assert_fail("func",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x2d4,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitReturn(Return *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  SVar1 = HeapType::getSignature(&this->func->type);
  if (SVar1.results.id.id != 0) {
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->value,SVar1.results.id);
    return;
  }
  return;
}

Assistant:

void visitReturn(Return* curr) {
    assert(func);
    auto type = func->getResults();
    if (type != Type::none) {
      note(&curr->value, type);
    }
  }